

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_ClassArray<ON_TextureCoordinates> * __thiscall
ON_ClassArray<ON_TextureCoordinates>::operator=
          (ON_ClassArray<ON_TextureCoordinates> *this,ON_ClassArray<ON_TextureCoordinates> *src)

{
  int local_1c;
  int i;
  ON_ClassArray<ON_TextureCoordinates> *src_local;
  ON_ClassArray<ON_TextureCoordinates> *this_local;
  
  if (this != src) {
    if (src->m_count < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < src->m_count) {
        SetCapacity(this,(long)src->m_count);
      }
      if (this->m_a != (ON_TextureCoordinates *)0x0) {
        this->m_count = src->m_count;
        for (local_1c = 0; local_1c < this->m_count; local_1c = local_1c + 1) {
          ON_TextureCoordinates::operator=(this->m_a + local_1c,src->m_a + local_1c);
        }
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}